

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlindex.cpp
# Opt level: O3

void __thiscall QSqlIndex::QSqlIndex(QSqlIndex *this,QSqlIndex *other)

{
  Data *pDVar1;
  Data *pDVar2;
  
  QSqlRecord::QSqlRecord(&this->super_QSqlRecord,&other->super_QSqlRecord);
  pDVar1 = (other->cursor).d.d;
  (this->cursor).d.d = pDVar1;
  (this->cursor).d.ptr = (other->cursor).d.ptr;
  (this->cursor).d.size = (other->cursor).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar1 = (other->nm).d.d;
  (this->nm).d.d = pDVar1;
  (this->nm).d.ptr = (other->nm).d.ptr;
  (this->nm).d.size = (other->nm).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar2 = (other->sorts).d.d;
  (this->sorts).d.d = pDVar2;
  (this->sorts).d.ptr = (other->sorts).d.ptr;
  (this->sorts).d.size = (other->sorts).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

QSqlIndex::QSqlIndex(const QSqlIndex& other)
    : QSqlRecord(other), cursor(other.cursor), nm(other.nm), sorts(other.sorts)
{
}